

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O3

ScalarFunctionSet * duckdb::BinFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *this;
  ScalarFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  allocator_type local_9b1;
  LogicalType local_9b0 [24];
  ScalarFunctionSet *local_998;
  code *local_990;
  undefined8 local_988;
  code *local_980;
  code *local_978;
  code *local_970;
  undefined8 local_968;
  code *local_960;
  code *local_958;
  code *local_950;
  undefined8 local_948;
  code *local_940;
  code *local_938;
  code *local_930;
  undefined8 local_928;
  code *local_920;
  code *local_918;
  code *local_910;
  undefined8 local_908;
  code *local_900;
  code *local_8f8;
  code *local_8f0;
  undefined8 local_8e8;
  code *local_8e0;
  code *local_8d8;
  LogicalType local_8d0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_8b8;
  LogicalType local_8a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_888;
  LogicalType local_870 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_858;
  LogicalType local_840 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_828;
  LogicalType local_810 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7f8;
  LogicalType local_7e0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_7c8;
  LogicalType local_7b0 [24];
  LogicalType local_798 [24];
  LogicalType local_780 [24];
  LogicalType local_768 [24];
  LogicalType local_750 [24];
  LogicalType local_738 [24];
  ScalarFunction local_720;
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  local_998 = in_RDI;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_9b0,VARCHAR);
  __l._M_len = 1;
  __l._M_array = local_9b0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7c8,__l,&local_9b1);
  duckdb::LogicalType::LogicalType(local_7e0,VARCHAR);
  local_8e8 = 0;
  local_8f0 = ToBinaryFunction<duckdb::string_t,duckdb::BinaryStrOperator>;
  local_8d8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_8e0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_738,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_158,&local_7c8,local_7e0,&local_8f0,0,0,0,0,local_738,0,0,0);
  this = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
         (local_998 + 0x20);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_158);
  local_158._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_158.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_158.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_158.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_158.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_158 + 0xb0U),(_Any_data *)((long)&local_158 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_158.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_738);
  if (local_8e0 != (code *)0x0) {
    (*local_8e0)(&local_8f0,&local_8f0,3);
  }
  duckdb::LogicalType::~LogicalType(local_7e0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7c8);
  duckdb::LogicalType::~LogicalType(local_9b0);
  duckdb::LogicalType::LogicalType(local_9b0,VARINT);
  __l_00._M_len = 1;
  __l_00._M_array = local_9b0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_7f8,__l_00,&local_9b1);
  duckdb::LogicalType::LogicalType(local_810,VARCHAR);
  local_908 = 0;
  local_910 = ToBinaryFunction<duckdb::string_t,duckdb::BinaryStrOperator>;
  local_8f8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_900 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_750,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_280,&local_7f8,local_810,&local_910,0,0,0,0,local_750,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_280);
  local_280._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_280.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_280.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_280.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_280.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_280 + 0xb0U),(_Any_data *)((long)&local_280 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_280.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_750);
  if (local_900 != (code *)0x0) {
    (*local_900)(&local_910,&local_910,3);
  }
  duckdb::LogicalType::~LogicalType(local_810);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_7f8);
  duckdb::LogicalType::~LogicalType(local_9b0);
  duckdb::LogicalType::LogicalType(local_9b0,UBIGINT);
  __l_01._M_len = 1;
  __l_01._M_array = local_9b0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_828,__l_01,&local_9b1);
  duckdb::LogicalType::LogicalType(local_840,VARCHAR);
  local_928 = 0;
  local_930 = ToBinaryFunction<unsigned_long,duckdb::BinaryIntegralOperator>;
  local_918 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_920 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_768,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_3a8,&local_828,local_840,&local_930,0,0,0,0,local_768,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_3a8);
  local_3a8._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_3a8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3a8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3a8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3a8.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_3a8 + 0xb0U),(_Any_data *)((long)&local_3a8 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_3a8.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_768);
  if (local_920 != (code *)0x0) {
    (*local_920)(&local_930,&local_930,3);
  }
  duckdb::LogicalType::~LogicalType(local_840);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_828);
  duckdb::LogicalType::~LogicalType(local_9b0);
  duckdb::LogicalType::LogicalType(local_9b0,BIGINT);
  __l_02._M_len = 1;
  __l_02._M_array = local_9b0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_858,__l_02,&local_9b1);
  duckdb::LogicalType::LogicalType(local_870,VARCHAR);
  local_948 = 0;
  local_950 = ToBinaryFunction<long,duckdb::BinaryIntegralOperator>;
  local_938 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_940 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_780,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_4d0,&local_858,local_870,&local_950,0,0,0,0,local_780,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_4d0);
  local_4d0._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_4d0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4d0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_4d0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4d0.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_4d0 + 0xb0U),(_Any_data *)((long)&local_4d0 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_4d0.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_780);
  if (local_940 != (code *)0x0) {
    (*local_940)(&local_950,&local_950,3);
  }
  duckdb::LogicalType::~LogicalType(local_870);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_858);
  duckdb::LogicalType::~LogicalType(local_9b0);
  duckdb::LogicalType::LogicalType(local_9b0,HUGEINT);
  __l_03._M_len = 1;
  __l_03._M_array = local_9b0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_888,__l_03,&local_9b1);
  duckdb::LogicalType::LogicalType(local_8a0,VARCHAR);
  local_968 = 0;
  local_970 = ToBinaryFunction<duckdb::hugeint_t,duckdb::BinaryHugeIntOperator>;
  local_958 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_960 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_798,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_5f8,&local_888,local_8a0,&local_970,0,0,0,0,local_798,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_5f8);
  local_5f8._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_5f8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5f8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5f8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5f8.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_5f8 + 0xb0U),(_Any_data *)((long)&local_5f8 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_5f8.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_798);
  if (local_960 != (code *)0x0) {
    (*local_960)(&local_970,&local_970,3);
  }
  duckdb::LogicalType::~LogicalType(local_8a0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_888);
  duckdb::LogicalType::~LogicalType(local_9b0);
  duckdb::LogicalType::LogicalType(local_9b0,UHUGEINT);
  __l_04._M_len = 1;
  __l_04._M_array = local_9b0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_8b8,__l_04,&local_9b1);
  duckdb::LogicalType::LogicalType(local_8d0,VARCHAR);
  local_988 = 0;
  local_990 = ToBinaryFunction<duckdb::uhugeint_t,duckdb::BinaryUhugeIntOperator>;
  local_978 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_980 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_7b0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_720,&local_8b8,local_8d0,&local_990,0,0,0,0,local_7b0,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>(this,&local_720);
  local_720._0_8_ = &PTR__ScalarFunction_008914d8;
  if (local_720.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_720.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_720.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_720.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_720 + 0xb0U),(_Any_data *)((long)&local_720 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_720.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_7b0);
  if (local_980 != (code *)0x0) {
    (*local_980)(&local_990,&local_990,3);
  }
  duckdb::LogicalType::~LogicalType(local_8d0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_8b8);
  duckdb::LogicalType::~LogicalType(local_9b0);
  return local_998;
}

Assistant:

ScalarFunctionSet BinFun::GetFunctions() {
	ScalarFunctionSet to_binary;

	to_binary.AddFunction(
	    ScalarFunction({LogicalType::VARCHAR}, LogicalType::VARCHAR, ToBinaryFunction<string_t, BinaryStrOperator>));
	to_binary.AddFunction(
	    ScalarFunction({LogicalType::VARINT}, LogicalType::VARCHAR, ToBinaryFunction<string_t, BinaryStrOperator>));
	to_binary.AddFunction(ScalarFunction({LogicalType::UBIGINT}, LogicalType::VARCHAR,
	                                     ToBinaryFunction<uint64_t, BinaryIntegralOperator>));
	to_binary.AddFunction(
	    ScalarFunction({LogicalType::BIGINT}, LogicalType::VARCHAR, ToBinaryFunction<int64_t, BinaryIntegralOperator>));
	to_binary.AddFunction(ScalarFunction({LogicalType::HUGEINT}, LogicalType::VARCHAR,
	                                     ToBinaryFunction<hugeint_t, BinaryHugeIntOperator>));
	to_binary.AddFunction(ScalarFunction({LogicalType::UHUGEINT}, LogicalType::VARCHAR,
	                                     ToBinaryFunction<uhugeint_t, BinaryUhugeIntOperator>));
	return to_binary;
}